

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsCalibration.cpp
# Opt level: O2

void __thiscall deqp::gls::TheilSenCalibrator::clear(TheilSenCalibrator *this)

{
  pointer pCVar1;
  
  MeasureState::clear(&this->m_measureState);
  pCVar1 = (this->m_calibrateIterations).
           super__Vector_base<deqp::gls::CalibrateIteration,_std::allocator<deqp::gls::CalibrateIteration>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_calibrateIterations).
      super__Vector_base<deqp::gls::CalibrateIteration,_std::allocator<deqp::gls::CalibrateIteration>_>
      ._M_impl.super__Vector_impl_data._M_finish != pCVar1) {
    (this->m_calibrateIterations).
    super__Vector_base<deqp::gls::CalibrateIteration,_std::allocator<deqp::gls::CalibrateIteration>_>
    ._M_impl.super__Vector_impl_data._M_finish = pCVar1;
  }
  this->m_state = INTERNALSTATE_CALIBRATING;
  return;
}

Assistant:

void TheilSenCalibrator::clear (void)
{
	m_measureState.clear();
	m_calibrateIterations.clear();
	m_state = INTERNALSTATE_CALIBRATING;
}